

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int read_dns_header(dns_header *header,char *src)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  
  header->id = *(ushort *)src << 8 | *(ushort *)src >> 8;
  header->field_1 = *(anon_union_2_2_657f633e_for_dns_header_1 *)(src + 2);
  uVar1 = *(ulong *)(src + 4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2 = psllw(auVar2,8);
  uVar1 = auVar2._0_8_ |
          CONCAT26((ushort)(uVar1 >> 0x38),
                   CONCAT24((ushort)(uVar1 >> 0x20) >> 8,
                            CONCAT22((ushort)(uVar1 >> 0x10) >> 8,(ushort)uVar1 >> 8)));
  header->qdcount = (short)uVar1;
  header->ancount = (short)(uVar1 >> 0x10);
  header->nscount = (short)(uVar1 >> 0x20);
  header->adcount = (short)(uVar1 >> 0x30);
  return 0xc;
}

Assistant:

int read_dns_header(struct dns_header *header, char *src) {
  struct dns_header *header_ = (struct dns_header *)src;
  header->id = ntohs(header_->id);
  header->flags = header_->flags;
  header->qdcount = ntohs(header_->qdcount);
  header->ancount = ntohs(header_->ancount);
  header->nscount = ntohs(header_->nscount);
  header->adcount = ntohs(header_->adcount);
  return sizeof(struct dns_header);
}